

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

metric_name __thiscall fasttext::Args::getAutotuneMetric(Args *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  metric_name mVar3;
  long lVar4;
  runtime_error *this_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __rhs = &this->autotuneMetric;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)__rhs);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (iVar2 == 0) {
    mVar3 = f1scoreLabel;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      mVar3 = f1score;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)__rhs);
      iVar2 = std::__cxx11::string::compare((char *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (iVar2 == 0) {
        lVar4 = std::__cxx11::string::find((char *)__rhs,0x13ed7f,0x12);
        mVar3 = (lVar4 != -1) + precisionAtRecall;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_40,(ulong)__rhs);
        iVar2 = std::__cxx11::string::compare((char *)&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p);
        }
        if (iVar2 != 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_40,"Unknown metric : ",__rhs);
          std::runtime_error::runtime_error(this_00,(string *)&local_40);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar4 = std::__cxx11::string::find((char *)__rhs,0x13ed7f,0x12);
        mVar3 = (lVar4 != -1) + recallAtPrecision;
      }
    }
  }
  return mVar3;
}

Assistant:

metric_name Args::getAutotuneMetric() const {
  if (autotuneMetric.substr(0, 3) == "f1:") {
    return metric_name::f1scoreLabel;
  } else if (autotuneMetric == "f1") {
    return metric_name::f1score;
  } else if (autotuneMetric.substr(0, 18) == "precisionAtRecall:") {
    size_t semicolon = autotuneMetric.find(":", 18);
    if (semicolon != std::string::npos) {
      return metric_name::precisionAtRecallLabel;
    }
    return metric_name::precisionAtRecall;
  } else if (autotuneMetric.substr(0, 18) == "recallAtPrecision:") {
    size_t semicolon = autotuneMetric.find(":", 18);
    if (semicolon != std::string::npos) {
      return metric_name::recallAtPrecisionLabel;
    }
    return metric_name::recallAtPrecision;
  }
  throw std::runtime_error("Unknown metric : " + autotuneMetric);
}